

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_join_internal.h
# Opt level: O3

string * __thiscall
absl::lts_20250127::strings_internal::JoinRange<google::protobuf::RepeatedField<int>>
          (string *__return_storage_ptr__,strings_internal *this,RepeatedField<int> *range,
          string_view separator)

{
  int iVar1;
  strings_internal *this_00;
  strings_internal *psVar2;
  ulong uVar3;
  string_view s;
  AlphaNumFormatterImpl *in_stack_ffffffffffffffb8;
  char local_39;
  size_t local_38;
  
  local_38 = separator._M_len;
  uVar3 = *(ulong *)this;
  if ((uVar3 & 4) == 0) {
    this_00 = this + 8;
  }
  else {
    this_00 = (strings_internal *)
              google::protobuf::internal::LongSooRep::elements((LongSooRep *)this);
    uVar3 = *(ulong *)this;
  }
  if ((uVar3 & 4) == 0) {
    psVar2 = this + 8;
  }
  else {
    psVar2 = (strings_internal *)
             google::protobuf::internal::LongSooRep::elements((LongSooRep *)this);
  }
  iVar1 = google::protobuf::internal::SooRep::size((SooRep *)this,(uVar3 & 4) == 0);
  s._M_str = &local_39;
  s._M_len = local_38;
  JoinAlgorithm<google::protobuf::internal::RepeatedIterator<int_const>,absl::lts_20250127::strings_internal::AlphaNumFormatterImpl>
            (__return_storage_ptr__,this_00,(RepeatedIterator<const_int>)(psVar2 + (long)iVar1 * 4),
             (RepeatedIterator<const_int>)range,s,in_stack_ffffffffffffffb8);
  return __return_storage_ptr__;
}

Assistant:

std::string JoinRange(const Range& range, absl::string_view separator) {
  using std::begin;
  using std::end;
  return JoinRange(begin(range), end(range), separator);
}